

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  int x;
  _Bind<void_(*(std::reference_wrapper<int>))(int_&)> local_5b0;
  code *local_5a0 [2];
  code *local_590;
  code *local_588;
  _Function_base local_580;
  _Function_base local_560;
  code *local_540 [2];
  code *local_530;
  code *local_528;
  result res2;
  thread_pool pool;
  result res [10];
  
  nonstd::thread_pool::thread_pool(&pool,0xe);
  nonstd::thread_pool::start();
  lVar2 = 0;
  do {
    nonstd::result::result((result *)((long)&res[0].m.super___mutex_base._M_mutex + lVar2));
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x3c0);
  for (lVar2 = 0; lVar2 != 0x3c0; lVar2 = lVar2 + 0x60) {
    local_5a0[1] = (code *)0x0;
    local_5a0[0] = doWork;
    local_588 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_590 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    nonstd::thread_pool::addJob
              (&pool,(_Function_base *)local_5a0,(long)&res[0].m.super___mutex_base._M_mutex + lVar2
              );
    std::_Function_base::~_Function_base((_Function_base *)local_5a0);
  }
  x = 10;
  nonstd::result::result(&res2);
  local_5b0._M_f = setNum;
  local_5b0._M_bound_args.super__Tuple_impl<0UL,_std::reference_wrapper<int>_>.
  super__Head_base<0UL,_std::reference_wrapper<int>,_false>._M_head_impl._M_data =
       (_Tuple_impl<0UL,_std::reference_wrapper<int>_>)
       (_Tuple_impl<0UL,_std::reference_wrapper<int>_>)&x;
  std::function<void()>::function<std::_Bind<void(*(std::reference_wrapper<int>))(int&)>,void>
            ((function<void()> *)&local_560,&local_5b0);
  nonstd::thread_pool::addJob(&pool,&local_560,&res2);
  std::_Function_base::~_Function_base(&local_560);
  nonstd::result::get();
  poVar1 = std::operator<<((ostream *)&std::cout,"x--. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_540[1] = (code *)0x0;
  local_540[0] = doWork;
  local_528 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_530 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  nonstd::thread_pool::addJob(&pool);
  std::_Function_base::~_Function_base((_Function_base *)local_540);
  local_5b0._M_f = setNum;
  local_5b0._M_bound_args.super__Tuple_impl<0UL,_std::reference_wrapper<int>_>.
  super__Head_base<0UL,_std::reference_wrapper<int>,_false>._M_head_impl._M_data =
       (_Tuple_impl<0UL,_std::reference_wrapper<int>_>)
       (_Tuple_impl<0UL,_std::reference_wrapper<int>_>)&x;
  std::function<void()>::function<std::_Bind<void(*(std::reference_wrapper<int>))(int&)>,void>
            ((function<void()> *)&local_580,&local_5b0);
  nonstd::thread_pool::addJob(&pool,&local_580);
  std::_Function_base::~_Function_base(&local_580);
  do {
    poVar1 = std::operator<<((ostream *)&std::cout,"main loop");
    std::endl<char,std::char_traits<char>>(poVar1);
    local_5b0._M_f = (_func_void_int_ptr *)0x5;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&local_5b0);
    poVar1 = std::operator<<((ostream *)&std::cout,"x---> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,x);
    std::endl<char,std::char_traits<char>>(poVar1);
  } while( true );
}

Assistant:

int main()
{
   nonstd::thread_pool pool(14);
   pool.start();

   nonstd::result res[10];

   for (int i = 0; i < 10; ++i)
     pool.addJob(doWork, res[i]);

   int x = 10;
   nonstd::result res2;
   //waiting for one of thread.
   pool.addJob(std::bind(setNum, std::ref(x)), res2);
   res2.get();
   std::cout << "x--. " << x << std::endl;
   pool.addJob(doWork);
   pool.addJob(std::bind(setNum, std::ref(x)));

   while (1)
     {
        std::cout << "main loop" << std::endl;
        std::this_thread::sleep_for(std::chrono::seconds(5));
        std::cout << "x---> " << x << std::endl;
     }

   pool.stop();

   return 0;
}